

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.c
# Opt level: O0

uint8_t decBiStr(char *targ,char *str1,char *str2)

{
  char *local_28;
  char *str2_local;
  char *str1_local;
  char *targ_local;
  
  local_28 = str2;
  str2_local = str1;
  for (str1_local = targ; (*str1_local == *str2_local || (*str1_local == *local_28));
      str1_local = str1_local + 1) {
    if (*str1_local == '\0') {
      return '\x01';
    }
    str2_local = str2_local + 1;
    local_28 = local_28 + 1;
  }
  return '\0';
}

Assistant:

static Flag decBiStr(const char *targ, const char *str1, const char *str2) {
  for (;;targ++, str1++, str2++) {
    if (*targ!=*str1 && *targ!=*str2) return 0;
    /* *targ has a match in one (or both, if terminator) */
    if (*targ=='\0') break;
    } /* forever */
  return 1;
  }